

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mpir.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  vector<double,_std::allocator<double>_> *cepstrum_00;
  vector<double,_std::allocator<double>_> *this;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_8;
  ostringstream error_message_7;
  vector<double,_std::allocator<double>_> minimum_phase_impulse_response;
  vector<double,_std::allocator<double>_> cepstrum;
  int output_length;
  int input_length;
  ostringstream error_message_6;
  CepstrumToMinimumPhaseImpulseResponse cepstrum_to_minimum_phase_impulse_response;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_input_files;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  int num_output_order;
  int num_input_order;
  option *in_stack_ffffffffffffecf8;
  int *in_stack_ffffffffffffed00;
  allocator *paVar4;
  undefined7 in_stack_ffffffffffffed08;
  undefined1 in_stack_ffffffffffffed0f;
  allocator *in_stack_ffffffffffffed10;
  undefined6 in_stack_ffffffffffffed18;
  undefined1 in_stack_ffffffffffffed1e;
  undefined1 in_stack_ffffffffffffed1f;
  ostream *in_stack_ffffffffffffed20;
  vector<double,_std::allocator<double>_> *minimum_phase_impulse_response_00;
  CepstrumToMinimumPhaseImpulseResponse *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffed40;
  int in_stack_ffffffffffffed48;
  undefined4 in_stack_ffffffffffffed4c;
  int read_point;
  char *pcVar5;
  int *in_stack_ffffffffffffed60;
  char *local_1268;
  bool local_123a;
  bool local_120a;
  bool local_11da;
  allocator local_11b9;
  string local_11b8 [32];
  ostringstream local_1198 [128];
  ostringstream *in_stack_ffffffffffffeee8;
  string *in_stack_ffffffffffffeef0;
  allocator local_1019;
  string local_1018 [32];
  ostringstream local_ff8 [383];
  vector<double,_std::allocator<double>_> local_e79;
  CepstrumToMinimumPhaseImpulseResponse local_e59;
  int local_e3c;
  int local_e38;
  allocator local_e31;
  string local_e30 [32];
  ostringstream local_e10 [376];
  CepstrumToMinimumPhaseImpulseResponse local_c98;
  char *local_c80;
  undefined4 local_c78;
  allocator local_c71;
  string local_c70 [32];
  ostringstream local_c50 [376];
  char local_ad8 [527];
  allocator local_8c9;
  string local_8c8 [32];
  ostringstream local_8a8 [376];
  char *local_730;
  allocator local_721;
  string local_720 [32];
  ostringstream local_700 [376];
  int local_588;
  allocator local_581;
  string local_580 [32];
  ostringstream local_560 [383];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 0xff;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_1c = ya_getopt_long((int)((ulong)in_stack_ffffffffffffed10 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffed0f,
                                                     in_stack_ffffffffffffed08),
                                   (char *)in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
                                   (int *)0x10370a), pcVar5 = ya_optarg, local_1c != -1) {
    switch(local_1c) {
    case 0x4d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,pcVar5,&local_219);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         in_stack_ffffffffffffed00);
      local_120a = !bVar1 || local_18 < 0;
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (local_120a) {
        std::__cxx11::ostringstream::ostringstream(local_398);
        poVar3 = std::operator<<((ostream *)local_398,"The argument for the -M option must be a ");
        std::operator<<(poVar3,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"c2mpir",&local_3b9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_398);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1728::PrintUsage(in_stack_ffffffffffffed20);
      return 1;
    case 0x68:
      anon_unknown.dwarf_1728::PrintUsage(in_stack_ffffffffffffed20);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,pcVar5,&local_3e1);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         in_stack_ffffffffffffed00);
      local_123a = !bVar1 || local_18 < 1;
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      if (local_123a) {
        std::__cxx11::ostringstream::ostringstream(local_560);
        std::operator<<((ostream *)local_560,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,"c2mpir",&local_581);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_560);
        return local_4;
      }
      local_18 = local_18 + -1;
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar5,&local_41);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         in_stack_ffffffffffffed00);
      local_11da = !bVar1 || local_14 < 0;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_11da) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar3 = std::operator<<((ostream *)local_1d0,"The argument for the -m option must be a ");
        std::operator<<(poVar3,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"c2mpir",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
    }
  }
  local_588 = local_8 - ya_optind;
  if (1 < local_588) {
    std::__cxx11::ostringstream::ostringstream(local_700);
    std::operator<<((ostream *)local_700,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"c2mpir",&local_721);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
    std::__cxx11::string::~string(local_720);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_700);
    return local_4;
  }
  if (local_588 == 0) {
    local_1268 = (char *)0x0;
  }
  else {
    local_1268 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_730 = local_1268;
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_8a8);
    std::operator<<((ostream *)local_8a8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8c8,"c2mpir",&local_8c9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
    std::__cxx11::string::~string(local_8c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8a8);
    return local_4;
  }
  std::ifstream::ifstream(local_ad8);
  pcVar5 = local_730;
  if (local_730 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_ad8,(_Ios_Openmode)pcVar5);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_c50);
      poVar3 = std::operator<<((ostream *)local_c50,"Cannot open file ");
      std::operator<<(poVar3,local_730);
      paVar4 = &local_c71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c70,"c2mpir",paVar4);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
      std::__cxx11::string::~string(local_c70);
      std::allocator<char>::~allocator((allocator<char> *)&local_c71);
      local_4 = 1;
      local_c78 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c50);
      goto LAB_001048ea;
    }
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    pcVar5 = (char *)&std::cin;
  }
  else {
    pcVar5 = local_ad8;
  }
  local_c80 = pcVar5;
  sptk::CepstrumToMinimumPhaseImpulseResponse::CepstrumToMinimumPhaseImpulseResponse
            (&local_c98,local_14,local_18);
  bVar1 = sptk::CepstrumToMinimumPhaseImpulseResponse::IsValid(&local_c98);
  read_point = CONCAT13(bVar1,(int3)in_stack_ffffffffffffed4c);
  if (bVar1) {
    local_e38 = local_14 + 1;
    local_e3c = local_18 + 1;
    cepstrum_00 = (vector<double,_std::allocator<double>_> *)(long)local_e38;
    this_00 = &local_e59;
    std::allocator<double>::allocator((allocator<double> *)0x1044da);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed20,
               CONCAT17(in_stack_ffffffffffffed1f,
                        CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
               (allocator_type *)in_stack_ffffffffffffed10);
    std::allocator<double>::~allocator((allocator<double> *)0x104500);
    this = (vector<double,_std::allocator<double>_> *)(long)local_e3c;
    minimum_phase_impulse_response_00 = &local_e79;
    std::allocator<double>::allocator((allocator<double> *)0x10451f);
    std::vector<double,_std::allocator<double>_>::vector
              (this,CONCAT17(in_stack_ffffffffffffed1f,
                             CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
               (allocator_type *)in_stack_ffffffffffffed10);
    std::allocator<double>::~allocator((allocator<double> *)0x104545);
    do {
      bVar1 = sptk::ReadStream<double>
                        (SUB81((ulong)pcVar5 >> 0x30,0),(int)pcVar5,read_point,
                         in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,(istream *)this_00,
                         in_stack_ffffffffffffed60);
      if (!bVar1) {
        local_4 = 0;
        local_c78 = 1;
        goto LAB_00104894;
      }
      bVar1 = sptk::CepstrumToMinimumPhaseImpulseResponse::Run
                        (this_00,cepstrum_00,minimum_phase_impulse_response_00);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_ff8);
        std::operator<<((ostream *)local_ff8,
                        "Failed to convert cepstrum to minimum phase impulse response");
        in_stack_ffffffffffffed10 = &local_1019;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1018,"c2mpir",in_stack_ffffffffffffed10);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_1018);
        std::allocator<char>::~allocator((allocator<char> *)&local_1019);
        local_4 = 1;
        local_c78 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_ff8);
        goto LAB_00104894;
      }
      bVar1 = sptk::WriteStream<double>
                        ((int)pcVar5,read_point,in_stack_ffffffffffffed40,(ostream *)this_00,
                         (int *)cepstrum_00);
    } while (bVar1);
    std::__cxx11::ostringstream::ostringstream(local_1198);
    std::operator<<((ostream *)local_1198,"Failed to write minimum phase impulse response");
    paVar4 = &local_11b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11b8,"c2mpir",paVar4);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
    std::__cxx11::string::~string(local_11b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11b9);
    local_4 = 1;
    local_c78 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1198);
LAB_00104894:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed10);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e10);
    std::operator<<((ostream *)local_e10,
                    "Failed to initialize CepstrumToMinimumPhaseImpulseResponse");
    paVar4 = &local_e31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e30,"c2mpir",paVar4);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
    std::__cxx11::string::~string(local_e30);
    std::allocator<char>::~allocator((allocator<char> *)&local_e31);
    local_4 = 1;
    local_c78 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e10);
  }
  sptk::CepstrumToMinimumPhaseImpulseResponse::~CepstrumToMinimumPhaseImpulseResponse(&local_c98);
LAB_001048ea:
  std::ifstream::~ifstream(local_ad8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_output_order(kDefaultNumOutputOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:M:l:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        --num_output_order;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::CepstrumToMinimumPhaseImpulseResponse
      cepstrum_to_minimum_phase_impulse_response(num_input_order,
                                                 num_output_order);
  if (!cepstrum_to_minimum_phase_impulse_response.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize CepstrumToMinimumPhaseImpulseResponse";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }

  const int input_length(num_input_order + 1);
  const int output_length(num_output_order + 1);
  std::vector<double> cepstrum(input_length);
  std::vector<double> minimum_phase_impulse_response(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &cepstrum, &input_stream,
                          NULL)) {
    if (!cepstrum_to_minimum_phase_impulse_response.Run(
            cepstrum, &minimum_phase_impulse_response)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert cepstrum to minimum phase impulse response";
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, minimum_phase_impulse_response,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write minimum phase impulse response";
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }
  }

  return 0;
}